

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O0

void sega_pcm_alloc_rom(void *chip,UINT32 memsize)

{
  void *pvVar1;
  segapcm_state *spcm;
  UINT32 memsize_local;
  void *chip_local;
  
  if (*(UINT32 *)((long)chip + 0x20) != memsize) {
    pvVar1 = realloc(*(void **)((long)chip + 0x28),(ulong)memsize);
    *(void **)((long)chip + 0x28) = pvVar1;
    memset(*(void **)((long)chip + 0x28),0x80,(ulong)memsize);
    *(UINT32 *)((long)chip + 0x20) = memsize;
    *(byte *)((long)chip + 0x31) =
         *(byte *)((long)chip + 0x32) & (byte)(0x1fffff >> (*(byte *)((long)chip + 0x30) & 0x1f));
  }
  return;
}

Assistant:

static void sega_pcm_alloc_rom(void *chip, UINT32 memsize)
{
	segapcm_state *spcm = (segapcm_state *)chip;
	
	if (spcm->ROMSize == memsize)
		return;
	
	spcm->rom = (UINT8*)realloc(spcm->rom, memsize);
#ifndef _DEBUG
	//memset(spcm->rom, 0xFF, memsize);
	// filling 0xFF would actually be more true to the hardware,
	// (unused ROMs have all FFs)
	// but 0x80 is the effective 'null' byte
	memset(spcm->rom, 0x80, memsize);
#else
	spcm->romusage = (UINT8*)realloc(spcm->romusage, memsize);
	// filling with FF makes it easier to find bugs in a .wav-log
	memset(spcm->rom, 0xFF, memsize);
	memset(spcm->romusage, 0x02, memsize);
#endif
	spcm->ROMSize = memsize;
	
	spcm->bankmask = spcm->intf_mask & (0x1fffff >> spcm->bankshift);
	
	return;
}